

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_ai::save(xr_level_ai *this,xr_writer *w)

{
  xr_writer *w_local;
  xr_level_ai *this_local;
  
  xr_writer::w_u32(w,this->m_version);
  xr_writer::w_u32(w,this->m_num_nodes);
  xr_writer::w_float(w,this->m_size);
  xr_writer::w_float(w,this->m_size_y);
  xr_writer::w<xray_re::_aabb<float>>(w,&this->m_aabb);
  xr_guid::save(&this->m_guid,w);
  if (this->m_version < 10) {
    xr_writer::w_cseq<xray_re::ai_node,write_node_v8>(w,this->m_num_nodes,this->m_nodes);
  }
  else {
    xr_writer::w_cseq<xray_re::ai_node,write_node_v10>(w,this->m_num_nodes,this->m_nodes);
  }
  return;
}

Assistant:

void xr_level_ai::save(xr_writer& w) const
{
	w.w_u32(m_version);
	w.w_u32(m_num_nodes);
	w.w_float(m_size);
	w.w_float(m_size_y);
	w.w(m_aabb);
	m_guid.save(w);
	if (m_version >= AI_VERSION_10)
		w.w_cseq(m_num_nodes, m_nodes, write_node_v10());
	else
		w.w_cseq(m_num_nodes, m_nodes, write_node_v8());
}